

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O0

locale booster::locale::impl_icu::create_convert(locale *in,cdata *cd,character_facet_type type)

{
  cdata *pcVar1;
  int in_ECX;
  long in_RDX;
  utf8_converter_impl *in_RSI;
  utf8_converter_impl *in_RDI;
  cdata *in_stack_ffffffffffffffa8;
  converter_impl<char> *in_stack_ffffffffffffffb0;
  locale *in_stack_ffffffffffffffb8;
  utf8_converter_impl *puVar2;
  
  if (in_ECX == 1) {
    if ((*(byte *)(in_RDX + 0x100) & 1) == 0) {
      puVar2 = in_RDI;
      pcVar1 = (cdata *)operator_new(0x110);
      converter_impl<char>::converter_impl(in_stack_ffffffffffffffb0,pcVar1);
      std::locale::locale<booster::locale::impl_icu::converter_impl<char>>
                ((locale *)puVar2,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    }
    else {
      puVar2 = in_RDI;
      pcVar1 = (cdata *)operator_new(0x38);
      utf8_converter_impl::utf8_converter_impl(puVar2,pcVar1);
      std::locale::locale<booster::locale::impl_icu::utf8_converter_impl>
                ((locale *)puVar2,(locale *)pcVar1,in_RSI);
    }
  }
  else if (in_ECX == 2) {
    puVar2 = in_RDI;
    operator_new(0x110);
    converter_impl<wchar_t>::converter_impl
              ((converter_impl<wchar_t> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::locale::locale<booster::locale::impl_icu::converter_impl<wchar_t>>
              ((locale *)puVar2,in_stack_ffffffffffffffb8,
               (converter_impl<wchar_t> *)in_stack_ffffffffffffffb0);
  }
  else {
    std::locale::locale((locale *)in_RDI,(locale *)in_RSI);
  }
  return (locale)(_Impl *)in_RDI;
}

Assistant:

std::locale create_convert(std::locale const &in,cdata const &cd,character_facet_type type)
    {
        switch(type) {
        case char_facet:
            #ifdef WITH_CASE_MAPS
            if(cd.utf8)
                return std::locale(in,new utf8_converter_impl(cd));
            #endif
            return std::locale(in,new converter_impl<char>(cd));
        case wchar_t_facet:
            return std::locale(in,new converter_impl<wchar_t>(cd));
        #ifdef BOOSTER_HAS_CHAR16_T
        case char16_t_facet:
            return std::locale(in,new converter_impl<char16_t>(cd));
        #endif
        #ifdef BOOSTER_HAS_CHAR32_T
        case char32_t_facet:
            return std::locale(in,new converter_impl<char32_t>(cd));
        #endif
        default:
            return in;
        }
    }